

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruleaction.hh
# Opt level: O2

void __thiscall RuleLoadVarnode::RuleLoadVarnode(RuleLoadVarnode *this,string *g)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"loadvarnode",&local_39);
  Rule::Rule(&this->super_Rule,g,0,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_Rule)._vptr_Rule = (_func_int **)&PTR__Rule_003f8c98;
  return;
}

Assistant:

RuleLoadVarnode(const string &g) : Rule(g, 0, "loadvarnode") {}